

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExprs
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int num_exprs)

{
  undefined8 *puVar1;
  size_type __new_size;
  SafeInt<int> local_9c;
  value_type local_98;
  
  SafeInt<int>::SafeInt<unsigned_long>
            (&local_9c,
             ((long)(this->linear_exprs_).
                    super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->linear_exprs_).
                    super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x1111111111111111);
  if (local_9c.value_ < 0) {
    if (num_exprs < -0x80000000 - local_9c.value_) goto LAB_00450d76;
  }
  else if ((int)(local_9c.value_ ^ 0x7fffffffU) < num_exprs) {
LAB_00450d76:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = &PTR__exception_005cb6c8;
    __cxa_throw(puVar1,&OverflowError::typeinfo,std::exception::~exception);
  }
  __new_size = (size_type)(local_9c.value_ + num_exprs);
  local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
             m_data.m_storage;
  local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity = 6;
  local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size = 0;
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::resize
            (&this->linear_exprs_,__new_size,&local_98);
  if (6 < local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
          super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity) {
    operator_delete(local_98.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr,
                    local_98.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity
                    << 4);
  }
  local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr = (ptr)0x0;
  std::
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ::resize(&this->nonlinear_exprs_,__new_size,(value_type *)&local_98);
  local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)CONCAT44(local_98.terms_.
                     super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                     super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr.
                     _4_4_,0x80000000);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->common_expr_positions_,__new_size,(value_type *)&local_98);
  return;
}

Assistant:

void AddCommonExprs(int num_exprs) {
    MP_ASSERT(num_exprs >= 0, "invalid size");
    std::size_t new_size = val(SafeInt<int>(linear_exprs_.size()) + num_exprs);
    linear_exprs_.resize(new_size, LinearExpr());
    nonlinear_exprs_.resize(new_size, NumericExpr());
    common_expr_positions_.resize(new_size, CommonExprPosDflt());
  }